

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

void __thiscall LiteScript::Class::AddStatic(Class *this,char *name,Variable *v)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  *this_00;
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  allocator local_91;
  Variable local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_60;
  
  this_00 = &this->s_members;
  ppVar1 = (this->s_members).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (this->s_members).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0x30;
  lVar4 = 0;
  do {
    lVar5 = lVar5 + -0x30;
    if ((((long)ppVar1 - (long)ppVar2) / 0x30 & 0xffffffffU) * 0x30 + lVar5 == 0) {
      std::__cxx11::string::string((string *)&local_80,name,&local_91);
      Variable::Variable(&local_90,v);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
                (&local_60,&local_80,&local_90);
      std::
      vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
      ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
                ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
                  *)this_00,&local_60);
      goto LAB_0013d2ca;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this_00->
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->first).
                                    _M_dataplus + lVar4),name);
    lVar4 = lVar4 + 0x30;
  } while (!bVar3);
  ppVar1 = (this_00->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_80,name,&local_91);
  Variable::Variable(&local_90,v);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
            (&local_60,&local_80,&local_90);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::_M_insert_rval(this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
                            *)((long)ppVar1 - lVar5),&local_60);
LAB_0013d2ca:
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  ::~pair(&local_60);
  Variable::~Variable(&local_90);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void LiteScript::Class::AddStatic(const char *name, const Variable &v) {
    for (unsigned int i = 0, sz = this->s_members.size(); i < sz; i++) {
        if (this->s_members[i].first == name) {
            this->s_members.emplace(this->s_members.begin() + i, std::pair<std::string, Variable>({ std::string(name), Variable(v) }));
            return;
        }
    }
    this->s_members.push_back({ std::string(name), Variable(v) });
}